

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<int&,char_const*&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,int *args,char **args_1)

{
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args_00;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  char **args_local_1;
  int *args_local;
  char *fmt_local;
  CfdSourceLocation *pCStack_a0;
  CfdLogLevel lvl_local;
  CfdSourceLocation *source_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_const_char_*>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_const_char_*>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_const_char_*>
  *vargs;
  int *local_48;
  v7 *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_const_char_*>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_const_char_*>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_const_char_*>
  *local_10;
  
  message.field_2._8_8_ = args_1;
  args_local = (int *)fmt;
  fmt_local._4_4_ = lvl;
  pCStack_a0 = source;
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_40 = (v7 *)&args_local;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_const_char_*>
             *)message.field_2._8_8_;
    local_48 = args;
    local_38 = (string *)local_e0;
    ::fmt::v7::make_args_checked<int&,char_const*&,char_const*,char>
              (&local_78,local_40,(char **)args,(remove_reference_t<int_&> *)message.field_2._8_8_,
               args_1);
    local_58 = &local_78;
    local_88 = ::fmt::v7::to_string_view<char,_0>(*(char **)local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&source_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xc1,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)source_local;
    format_str.data_ = (char *)local_88.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_e0,(detail *)local_88.data_,format_str,args_00);
    WriteLog(pCStack_a0,fmt_local._4_4_,(string *)local_e0);
    ::std::__cxx11::string::~string((string *)local_e0);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}